

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O1

shared_ptr<unsigned_short> __thiscall
chaiscript::bootstrap::detail::construct_pod<unsigned_short>(detail *this,Boxed_Number *v)

{
  unsigned_short uVar1;
  undefined8 *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<unsigned_short> sVar3;
  
  uVar1 = Boxed_Number::get_as<unsigned_short>(v);
  *(undefined8 *)this = 0;
  puVar2 = (undefined8 *)operator_new(0x18);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_ptr_inplace_003129e8;
  *(unsigned_short *)(puVar2 + 2) = uVar1;
  *(undefined8 **)(this + 8) = puVar2;
  *(undefined8 **)this = puVar2 + 2;
  sVar3.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<unsigned_short>)
         sVar3.super___shared_ptr<unsigned_short,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<P1> construct_pod(const Boxed_Number &v)
      {
        return std::make_shared<P1>(v.get_as<P1>());
      }